

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__simple_alpha_weight_4ch(float *decode_buffer,int width_times_channels)

{
  float fVar1;
  float fVar2;
  float *decode;
  float *pfVar3;
  
  pfVar3 = decode_buffer;
  while (pfVar3 + 8 <= decode_buffer + width_times_channels) {
    fVar1 = pfVar3[3];
    fVar2 = pfVar3[7];
    *pfVar3 = fVar1 * *pfVar3;
    pfVar3[1] = fVar1 * pfVar3[1];
    pfVar3[2] = fVar1 * pfVar3[2];
    pfVar3[3] = fVar1 * 1.0;
    pfVar3[4] = fVar2 * pfVar3[4];
    pfVar3[5] = fVar2 * pfVar3[5];
    pfVar3[6] = fVar2 * pfVar3[6];
    pfVar3[7] = fVar2 * 1.0;
    pfVar3 = pfVar3 + 8;
  }
  if (pfVar3 < decode_buffer + width_times_channels) {
    fVar1 = pfVar3[3];
    *pfVar3 = fVar1 * *pfVar3;
    pfVar3[1] = fVar1 * pfVar3[1];
    pfVar3[2] = fVar1 * pfVar3[2];
    pfVar3[3] = fVar1 * 1.0;
  }
  return;
}

Assistant:

static void stbir__simple_alpha_weight_4ch( float * decode_buffer, int width_times_channels )
{
  float STBIR_STREAMOUT_PTR(*) decode = decode_buffer;
  float const * end_decode = decode_buffer + width_times_channels;

  #ifdef STBIR_SIMD
  {
    decode += 2 * stbir__simdfX_float_count;
    STBIR_NO_UNROLL_LOOP_START
    while ( decode <= end_decode )
    {
      stbir__simdfX d0,a0,d1,a1;
      STBIR_NO_UNROLL(decode);
      stbir__simdfX_load( d0, decode-2*stbir__simdfX_float_count );
      stbir__simdfX_load( d1, decode-2*stbir__simdfX_float_count+stbir__simdfX_float_count );
      stbir__simdfX_aaa1( a0, d0, STBIR_onesX );
      stbir__simdfX_aaa1( a1, d1, STBIR_onesX );
      stbir__simdfX_mult( d0, d0, a0 );
      stbir__simdfX_mult( d1, d1, a1 );
      stbir__simdfX_store ( decode-2*stbir__simdfX_float_count, d0 );
      stbir__simdfX_store ( decode-2*stbir__simdfX_float_count+stbir__simdfX_float_count, d1 );
      decode += 2 * stbir__simdfX_float_count;
    }
    decode -= 2 * stbir__simdfX_float_count;

    // few last pixels remnants
    #ifdef STBIR_SIMD8
    STBIR_NO_UNROLL_LOOP_START
    while ( decode < end_decode )
    #else
    if ( decode < end_decode )
    #endif
    {
      stbir__simdf d,a;
      stbir__simdf_load( d, decode );
      stbir__simdf_aaa1( a, d, STBIR__CONSTF(STBIR_ones) );
      stbir__simdf_mult( d, d, a );
      stbir__simdf_store ( decode, d );
      decode += 4;
    }
  }

  #else

  while( decode < end_decode )
  {
    float alpha = decode[3];
    decode[0] *= alpha;
    decode[1] *= alpha;
    decode[2] *= alpha;
    decode += 4;
  }

  #endif
}